

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statisticspooling.cpp
# Opt level: O3

int __thiscall
ncnn::StatisticsPooling::forward(StatisticsPooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  void *pvVar7;
  int _w;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  iVar3 = bottom_blob->c;
  lVar11 = (long)iVar3;
  uVar10 = iVar2 * iVar1;
  _w = iVar3 << (this->include_stddev != 0);
  Mat::create(top_blob,_w,bottom_blob->elemsize,opt->blob_allocator);
  fVar13 = (float)iVar1;
  fVar12 = (float)iVar2;
  if (0 < lVar11) {
    pvVar7 = bottom_blob->data;
    sVar4 = bottom_blob->cstep;
    pvVar5 = top_blob->data;
    sVar6 = bottom_blob->elemsize;
    lVar8 = 0;
    do {
      fVar14 = 0.0;
      if (0 < (int)uVar10) {
        uVar9 = 0;
        do {
          fVar14 = fVar14 + *(float *)((long)pvVar7 + uVar9 * 4);
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
      }
      *(float *)((long)pvVar5 + lVar8 * 4) = fVar14 * (1.0 / (fVar12 * fVar13));
      lVar8 = lVar8 + 1;
      pvVar7 = (void *)((long)pvVar7 + sVar4 * sVar6);
    } while (lVar8 != lVar11);
  }
  if (iVar3 < _w) {
    pvVar7 = bottom_blob->data;
    sVar4 = bottom_blob->cstep;
    pvVar5 = top_blob->data;
    sVar6 = bottom_blob->elemsize;
    lVar8 = lVar11;
    do {
      if ((int)uVar10 < 1) {
        fVar14 = 0.0;
      }
      else {
        fVar14 = 0.0;
        uVar9 = 0;
        do {
          fVar15 = *(float *)((long)pvVar7 + uVar9 * 4) -
                   *(float *)((long)pvVar5 + (lVar8 - lVar11) * 4);
          fVar14 = fVar14 + fVar15 * fVar15;
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
      }
      *(float *)((long)pvVar5 + lVar8 * 4) = SQRT(fVar14 * (1.0 / (fVar12 * fVar13)));
      lVar8 = lVar8 + 1;
      pvVar7 = (void *)((long)pvVar7 + sVar4 * sVar6);
    } while (lVar8 != _w);
  }
  return 0;
}

Assistant:

int StatisticsPooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int size = w * h;
    size_t elemsize = bottom_blob.elemsize;

    int out_channels = channels;
    if (include_stddev)
    {
        out_channels *= 2;
    }

    top_blob.create(out_channels, elemsize, opt.blob_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float mean = 0.f;
        for (int i = 0; i < size; i++)
        {
            mean += ptr[i];
        }
        top_blob[q] = mean / w / h;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = channels; q < out_channels; q++)
    {
        const float* ptr = bottom_blob.channel(q - channels);

        float std = 0.f;
        for (int i = 0; i < size; i++)
        {
            std += powf((ptr[i] - top_blob[q - channels]), 2);
        }
        top_blob[q] = sqrtf(std / w / h);
    }

    return 0;
}